

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.c
# Opt level: O2

void golf_gi_add_lightmap_section
               (golf_gi_t *gi,golf_lightmap_section_t *lightmap_section,golf_model_t *model,
               golf_transform_t transform,golf_movement_t movement,_Bool should_draw)

{
  vec_golf_gi_lightmap_section_t *data;
  int *length;
  uint uVar1;
  golf_gi_lightmap_section_t *pgVar2;
  vec3 *pvVar3;
  undefined8 uVar4;
  vec2 vVar5;
  vec2 *pvVar6;
  int iVar7;
  int iVar8;
  int i;
  long lVar9;
  long lVar10;
  golf_gi_lightmap_section_t section;
  
  if (gi->has_cur_entity == true) {
    section.positions.data = (vec3 *)0x0;
    section.positions.length = 0;
    section.positions.capacity = 0;
    section.positions.alloc_category = "gi";
    section.normals.data = (vec3 *)0x0;
    section.normals.length = 0;
    section.normals.capacity = 0;
    section.normals.alloc_category = "gi";
    section.lightmap_uvs.data = (vec2 *)0x0;
    section.lightmap_uvs.length = 0;
    section.lightmap_uvs.capacity = 0;
    section.lightmap_uvs.alloc_category = "gi";
    uVar1 = (model->positions).length;
    iVar7 = vec_reserve_po2_((char **)&section.positions,&section.positions.length,
                             &section.positions.capacity,0xc,uVar1,"gi");
    if (iVar7 == 0) {
      lVar10 = 0;
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (; (ulong)uVar1 * 0xc - lVar10 != 0; lVar10 = lVar10 + 0xc) {
        lVar9 = (long)section.positions.length;
        section.positions.length = section.positions.length + 1;
        pvVar3 = (model->positions).data;
        uVar4 = *(undefined8 *)((long)&pvVar3->x + lVar10);
        section.positions.data[lVar9].x = (float)(int)uVar4;
        section.positions.data[lVar9].y = (float)(int)((ulong)uVar4 >> 0x20);
        section.positions.data[lVar9].z = *(float *)((long)&pvVar3->z + lVar10);
      }
    }
    uVar1 = (model->normals).length;
    iVar7 = vec_reserve_po2_((char **)&section.normals,&section.normals.length,
                             &section.normals.capacity,0xc,section.normals.length + uVar1,
                             section.normals.alloc_category);
    if (iVar7 == 0) {
      lVar10 = 0;
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (; (ulong)uVar1 * 0xc - lVar10 != 0; lVar10 = lVar10 + 0xc) {
        lVar9 = (long)section.normals.length;
        section.normals.length = section.normals.length + 1;
        pvVar3 = (model->normals).data;
        uVar4 = *(undefined8 *)((long)&pvVar3->x + lVar10);
        section.normals.data[lVar9].x = (float)(int)uVar4;
        section.normals.data[lVar9].y = (float)(int)((ulong)uVar4 >> 0x20);
        section.normals.data[lVar9].z = *(float *)((long)&pvVar3->z + lVar10);
      }
    }
    for (iVar7 = 0; iVar7 < (model->positions).length; iVar7 = iVar7 + 1) {
      iVar8 = vec_expand_((char **)&section.lightmap_uvs,&section.lightmap_uvs.length,
                          &section.lightmap_uvs.capacity,8,section.lightmap_uvs.alloc_category);
      pvVar6 = section.lightmap_uvs.data;
      if (iVar8 == 0) {
        lVar10 = (long)section.lightmap_uvs.length;
        section.lightmap_uvs.length = section.lightmap_uvs.length + 1;
        vVar5 = vec2_create(0.0,0.0);
        pvVar6[lVar10] = vVar5;
      }
    }
    section.transform.scale.y = transform.scale.y;
    section.transform.scale.z = transform.scale.z;
    section.transform.rotation.y = transform.rotation.y;
    section.transform.rotation.z = transform.rotation.z;
    section.transform.rotation.w = transform.rotation.w;
    section.transform.scale.x = transform.scale.x;
    section.transform.position.x = transform.position.x;
    section.transform.position.y = transform.position.y;
    section.transform.position.z = transform.position.z;
    section.transform.rotation.x = transform.rotation.x;
    section.movement.type = movement.type;
    section.movement.repeats = movement.repeats;
    section.movement._5_3_ = movement._5_3_;
    section.movement.t0 = movement.t0;
    section.movement.length = movement.length;
    section.movement.field_4._0_8_ = movement.field_4._0_8_;
    section.movement.field_4._8_8_ = movement.field_4._8_8_;
    section.movement.field_4._16_8_ = movement.field_4._16_8_;
    data = &(gi->cur_entity).gi_lightmap_sections;
    length = &(gi->cur_entity).gi_lightmap_sections.length;
    section.should_draw = should_draw;
    section.lightmap_section = lightmap_section;
    iVar7 = vec_expand_((char **)data,length,&(gi->cur_entity).gi_lightmap_sections.capacity,0xa8,
                        (gi->cur_entity).gi_lightmap_sections.alloc_category);
    if (iVar7 == 0) {
      iVar7 = *length;
      pgVar2 = data->data;
      *length = iVar7 + 1;
      memcpy(pgVar2 + iVar7,&section,0xa8);
    }
  }
  return;
}

Assistant:

void golf_gi_add_lightmap_section(golf_gi_t *gi, golf_lightmap_section_t *lightmap_section, golf_model_t *model, golf_transform_t transform, golf_movement_t movement, bool should_draw) {
    if (!gi->has_cur_entity) {
        return;
    }

    golf_gi_lightmap_section_t section;
    vec_init(&section.positions, "gi");
    vec_init(&section.normals, "gi");
    vec_init(&section.lightmap_uvs, "gi");
    vec_pusharr(&section.positions, model->positions.data, model->positions.length);
    vec_pusharr(&section.normals, model->normals.data, model->normals.length);
    for (int i = 0; i < model->positions.length; i++) {
        vec_push(&section.lightmap_uvs, V2(0, 0));
    }
    section.transform = transform;
    section.movement = movement;
    section.lightmap_section = lightmap_section;
    section.should_draw = should_draw;
    vec_push(&gi->cur_entity.gi_lightmap_sections, section);
}